

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::PersistentColumnData::Serialize(PersistentColumnData *this,Serializer *serializer)

{
  vector<duckdb::PersistentColumnData,_true> *this_00;
  PhysicalType PVar1;
  const_reference pvVar2;
  InternalException *this_01;
  long lVar3;
  size_type sVar4;
  size_type __n;
  string local_50;
  
  if (this->has_updates == true) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Column data with updates cannot be serialized","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::DataPointer,true>>
            (serializer,100,"data_pointers",&this->pointers);
  if ((this->child_columns).
      super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
      super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->child_columns).
      super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
      super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  this_00 = &this->child_columns;
  pvVar2 = vector<duckdb::PersistentColumnData,_true>::operator[](this_00,0);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"validity");
  (*serializer->_vptr_Serializer[6])(serializer);
  Serialize(pvVar2,serializer);
  (*serializer->_vptr_Serializer[7])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  PVar1 = this->physical_type;
  if (PVar1 != ARRAY) {
    if (PVar1 == STRUCT) {
      sVar4 = (long)(this->child_columns).
                    super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    .
                    super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->child_columns).
                    super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    .
                    super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"sub_columns");
      (*serializer->_vptr_Serializer[8])(serializer,sVar4 - 1);
      lVar3 = 0x48;
      if (sVar4 != 1) {
        __n = 1;
        do {
          pvVar2 = vector<duckdb::PersistentColumnData,_true>::operator[](this_00,__n);
          (*serializer->_vptr_Serializer[6])(serializer);
          Serialize(pvVar2,serializer);
          (*serializer->_vptr_Serializer[7])(serializer);
          __n = __n + 1;
        } while (sVar4 != __n);
      }
      goto LAB_0060addd;
    }
    if (PVar1 != LIST) {
      return;
    }
  }
  pvVar2 = vector<duckdb::PersistentColumnData,_true>::operator[](this_00,1);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"child_column");
  (*serializer->_vptr_Serializer[6])(serializer);
  Serialize(pvVar2,serializer);
  lVar3 = 0x38;
LAB_0060addd:
  (**(code **)((long)serializer->_vptr_Serializer + lVar3))(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void PersistentColumnData::Serialize(Serializer &serializer) const {
	if (has_updates) {
		throw InternalException("Column data with updates cannot be serialized");
	}
	serializer.WritePropertyWithDefault(100, "data_pointers", pointers);
	if (child_columns.empty()) {
		// validity column
		D_ASSERT(physical_type == PhysicalType::BIT);
		return;
	}
	serializer.WriteProperty(101, "validity", child_columns[0]);
	if (physical_type == PhysicalType::ARRAY || physical_type == PhysicalType::LIST) {
		D_ASSERT(child_columns.size() == 2);
		serializer.WriteProperty(102, "child_column", child_columns[1]);
	} else if (physical_type == PhysicalType::STRUCT) {
		serializer.WriteList(102, "sub_columns", child_columns.size() - 1,
		                     [&](Serializer::List &list, idx_t i) { list.WriteElement(child_columns[i + 1]); });
	}
}